

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportError
          (ParserImpl *this,int line,int col,string_view message)

{
  string_view v;
  LogMessage *pLVar1;
  string_view sVar2;
  LogMessage local_90;
  Voidify local_79;
  ParserImpl *local_78;
  size_t sStack_70;
  string_view local_68;
  LogMessage local_40;
  Voidify local_29;
  int local_28;
  int local_24;
  int col_local;
  int line_local;
  ParserImpl *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (ParserImpl *)message._M_len;
  this->had_errors_ = true;
  local_28 = col;
  local_24 = line;
  _col_local = this;
  if (this->error_collector_ == (ErrorCollector *)0x0) {
    if (line < 0) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0x17e);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [27])"Error parsing text-format ");
      sVar2 = Descriptor::full_name(this->root_message_type_);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [3])0xbe0b13);
      sVar2._M_str = (char *)message_local._M_len;
      sVar2._M_len = (size_t)this_local;
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar1);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_90);
    }
    else {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0x17a);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [27])"Error parsing text-format ");
      local_68 = Descriptor::full_name(this->root_message_type_);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_68);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [3])0xbe0b13);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_24 + 1);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [2])0xb36c8c);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_28 + 1);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [3])0xbe0b13);
      local_78 = this_local;
      sStack_70 = message_local._M_len;
      v._M_str = (char *)message_local._M_len;
      v._M_len = (size_t)this_local;
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
    }
  }
  else {
    (*this->error_collector_->_vptr_ErrorCollector[2])
              (this->error_collector_,(ulong)(uint)line,(ulong)(uint)col,this_local,
               message_local._M_len);
  }
  return;
}

Assistant:

void ReportError(int line, int col, absl::string_view message) {
    had_errors_ = true;
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG(ERROR) << "Error parsing text-format "
                        << root_message_type_->full_name() << ": " << (line + 1)
                        << ":" << (col + 1) << ": " << message;
      } else {
        ABSL_LOG(ERROR) << "Error parsing text-format "
                        << root_message_type_->full_name() << ": " << message;
      }
    } else {
      error_collector_->RecordError(line, col, message);
    }
  }